

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixRead(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  int iVar1;
  int nCopy;
  int got;
  unixFile *pFile;
  sqlite3_int64 offset_local;
  void *pvStack_20;
  int amt_local;
  void *pBuf_local;
  sqlite3_file *id_local;
  
  pFile = (unixFile *)offset;
  offset_local._4_4_ = amt;
  pvStack_20 = pBuf;
  if (offset < (long)id[10].pMethods) {
    if (offset + amt <= (long)id[10].pMethods) {
      memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),(long)amt);
      return 0;
    }
    iVar1 = (int)id[10].pMethods - (int)offset;
    memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),(long)iVar1);
    pvStack_20 = (void *)((long)pBuf + (long)iVar1);
    offset_local._4_4_ = amt - iVar1;
    pFile = (unixFile *)(iVar1 + offset);
  }
  iVar1 = seekAndRead((unixFile *)id,(sqlite3_int64)pFile,pvStack_20,offset_local._4_4_);
  if (iVar1 == offset_local._4_4_) {
    id_local._4_4_ = 0;
  }
  else if (iVar1 < 0) {
    id_local._4_4_ = 0x10a;
  }
  else {
    storeLastErrno((unixFile *)id,0);
    memset((void *)((long)pvStack_20 + (long)iVar1),0,(long)(offset_local._4_4_ - iVar1));
    id_local._4_4_ = 0x20a;
  }
  return id_local._4_4_;
}

Assistant:

static int unixRead(
  sqlite3_file *id, 
  void *pBuf, 
  int amt,
  sqlite3_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  assert( id );
  assert( offset>=0 );
  assert( amt>0 );

  /* If this is a database file (not a journal, master-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pPreallocatedUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE 
  );
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this read request as possible by transfering
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  got = seekAndRead(pFile, offset, pBuf, amt);
  if( got==amt ){
    return SQLITE_OK;
  }else if( got<0 ){
    /* lastErrno set by seekAndRead */
    return SQLITE_IOERR_READ;
  }else{
    storeLastErrno(pFile, 0);   /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    memset(&((char*)pBuf)[got], 0, amt-got);
    return SQLITE_IOERR_SHORT_READ;
  }
}